

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  Value VVar1;
  global_State *pgVar2;
  StkId pTVar3;
  TValue *pTVar4;
  GCObject *pGVar5;
  long lVar6;
  long lVar7;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  if (L->ci == L->base_ci) {
    pTVar4 = &L->l_gt;
  }
  else {
    pTVar4 = (TValue *)&(((L->ci->func->value).gc)->h).array;
  }
  VVar1 = pTVar4->value;
  pGVar5 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,(ulong)(n * 0x10 + 0x28));
  pgVar2 = L->l_G;
  (pGVar5->gch).next = pgVar2->rootgc;
  pgVar2->rootgc = pGVar5;
  (pGVar5->gch).marked = pgVar2->currentwhite & 3;
  (pGVar5->gch).tt = '\x06';
  (pGVar5->h).flags = '\x01';
  (pGVar5->h).array = (TValue *)VVar1;
  (pGVar5->h).lsizenode = (lu_byte)n;
  (pGVar5->h).node = (Node *)fn;
  L->top = L->top + -(ulong)(uint)n;
  if (n != 0) {
    lVar6 = (long)n;
    lVar7 = lVar6 << 4;
    do {
      pTVar3 = L->top;
      *(undefined8 *)((long)pGVar5 + lVar7 + 0x18) =
           *(undefined8 *)((long)&pTVar3[-1].value + lVar7);
      *(undefined4 *)((long)pGVar5 + lVar7 + 0x20) = *(undefined4 *)((long)pTVar3 + lVar7 + -8);
      lVar7 = lVar7 + -0x10;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pTVar3 = L->top;
  (pTVar3->value).p = pGVar5;
  pTVar3->tt = 6;
  L->top = L->top + 1;
  return;
}

Assistant:

static void lua_pushcclosure(lua_State*L,lua_CFunction fn,int n){
Closure*cl;
luaC_checkGC(L);
api_checknelems(L,n);
cl=luaF_newCclosure(L,n,getcurrenv(L));
cl->c.f=fn;
L->top-=n;
while(n--)
setobj(L,&cl->c.upvalue[n],L->top+n);
setclvalue(L,L->top,cl);
api_incr_top(L);
}